

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

ON_UuidIndex * __thiscall ON_UuidIndexList::SearchHelper(ON_UuidIndexList *this,ON_UUID *uuid)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ON_UuidIndex *pOVar4;
  ON_UuidIndex *b;
  long lVar5;
  long lVar6;
  
  uVar2 = this->m_sorted_count;
  if ((8 < (this->super_ON_SimpleArray<ON_UuidIndex>).m_count - uVar2) ||
     (this->m_removed_count != 0)) {
    ImproveSearchSpeed(this);
    uVar2 = this->m_sorted_count;
  }
  if (uVar2 == 0) {
    lVar5 = 0;
  }
  else {
    pOVar4 = (ON_UuidIndex *)
             bsearch(uuid,(this->super_ON_SimpleArray<ON_UuidIndex>).m_a,(ulong)uVar2,0x14,
                     compar_uuidindex_uuid);
    if (pOVar4 != (ON_UuidIndex *)0x0) {
      return pOVar4;
    }
    lVar5 = (long)(int)this->m_sorted_count;
  }
  iVar1 = (this->super_ON_SimpleArray<ON_UuidIndex>).m_count;
  lVar6 = lVar5 + -1;
  pOVar4 = (this->super_ON_SimpleArray<ON_UuidIndex>).m_a + lVar5;
  do {
    b = pOVar4;
    lVar6 = lVar6 + 1;
    if (iVar1 <= lVar6) {
      return (ON_UuidIndex *)0x0;
    }
    iVar3 = ON_UuidList::CompareUuid(uuid,&b->m_id);
    pOVar4 = b + 1;
  } while (iVar3 != 0);
  return b;
}

Assistant:

ON_UuidIndex* ON_UuidIndexList::SearchHelper(const ON_UUID* uuid) const
{
  if ( m_count - m_sorted_count > 8 || m_removed_count > 0 )
  {
    // time to resort the array so that the speedy
    // bsearch() can be used to find uuids
    const_cast<ON_UuidIndexList*>(this)->ImproveSearchSpeed();
  }

  ON_UuidIndex* p = (m_sorted_count > 0 )
                   ? (ON_UuidIndex*)bsearch( uuid, m_a, m_sorted_count, 
                                        sizeof(m_a[0]), 
                                        (int(*)(const void*,const void*))compar_uuidindex_uuid ) 
                   : 0;
  if (0 == p)
  {
    // do a slow search on the last m_count-m_sort_count elements
    // in the array.
    int i;
    for ( i = m_sorted_count; i < m_count; i++ )
    {
      if ( 0 == ON_UuidList::CompareUuid(uuid,&m_a[i].m_id) )
      {
        p = m_a+i;
        break;
      }
    }
  }

  return p;
}